

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O3

void __thiscall
DReachabilityPropagator::explain_dominator(DReachabilityPropagator *this,int u,int dom,Clause **r)

{
  byte bVar1;
  uint uVar2;
  BoolView *pBVar3;
  uint uVar4;
  ulong uVar5;
  size_t __size;
  ulong uVar6;
  Clause *c;
  allocator_type local_99;
  vec<Lit> local_98;
  Clause *local_80;
  vector<bool,_std::allocator<bool>_> local_78;
  vector<bool,_std::allocator<bool>_> local_50;
  
  local_98.sz = 0;
  local_98.cap = 0;
  local_98.data = (Lit *)0x0;
  vec<Lit>::push(&local_98);
  uVar2 = (this->super_GraphPropagator).vs.data[(uint)this->root].v;
  local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._0_4_ =
       (uint)((int)sat.assigns.data[uVar2] - 1U < 0xfffffffd) + uVar2 * 2;
  vec<Lit>::push(&local_98,(Lit *)&local_78);
  pBVar3 = (this->super_GraphPropagator).vs.data;
  uVar2 = pBVar3[(uint)u].v;
  bVar1 = sat.assigns.data[uVar2];
  if ((bVar1 != 0) && ((uint)pBVar3[(uint)u].s * -2 + 1 == (int)(char)bVar1)) {
    local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p._0_4_ = (uint)(bVar1 < 0xfe) + uVar2 * 2;
    vec<Lit>::push(&local_98,(Lit *)&local_78);
  }
  local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_78,(long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_50,
             (allocator_type *)&local_80);
  reverseDFS(this,u,&local_78,dom);
  local_80 = (Clause *)((ulong)local_80 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_50,(long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_80,&local_99);
  reverseDFStoBorder(this,u,&local_50,&local_78,&local_98,dom);
  uVar2 = local_98.sz;
  uVar6 = local_98._0_8_ & 0xffffffff;
  __size = 8;
  if (local_98.sz != 0) {
    __size = (ulong)(local_98.sz - 1) * 4 + 8;
  }
  local_80 = (Clause *)malloc(__size);
  uVar4 = uVar2 << 8;
  local_80->data[0].x = -2;
  *(uint *)local_80 = uVar4;
  if (uVar2 != 0) {
    uVar5 = 0;
    do {
      local_80->data[uVar5].x = local_98.data[uVar5].x;
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
  }
  *(uint *)local_80 = uVar4 | 2;
  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_80);
  *r = local_80;
  if ((void *)CONCAT71(local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_,
                       local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_1_) !=
      (void *)0x0) {
    operator_delete((void *)CONCAT71(local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                     ._1_7_,local_50.super__Bvector_base<std::allocator<bool>_>.
                                            _M_impl.super__Bvector_impl_data._M_start.
                                            super__Bit_iterator_base._M_p._0_1_));
  }
  if ((void *)CONCAT44(local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                       (int)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) !=
      (void *)0x0) {
    operator_delete((void *)CONCAT44(local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                     ._4_4_,(int)local_78.super__Bvector_base<std::allocator<bool>_>
                                                 ._M_impl.super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p));
  }
  if (local_98.data != (Lit *)0x0) {
    free(local_98.data);
  }
  return;
}

Assistant:

void DReachabilityPropagator::explain_dominator(int u, int dom, Clause** r) {
	if (DEBUG) {
		std::cout << "Explain dominators " << getNodeVar(get_root_idx()).isFixed()
							<< getNodeVar(u).isFixed() << '\n';
	}
	vec<Lit> ps;
	ps.push();
	ps.push(getNodeVar(get_root_idx()).getValLit());
	if (getNodeVar(u).isFixed() && getNodeVar(u).isTrue()) {
		ps.push(getNodeVar(u).getValLit());
	}
	std::vector<bool> red(nbNodes(), false);
	reverseDFS(u, red, dom);
	std::vector<bool> v(nbNodes(), false);
	reverseDFStoBorder(u, v, red, ps, dom);
	if (DEBUG) {
		std::cout << "Size expl for dominator " << ps.size() << '\n';
	}
	*r = Reason_new(ps);
}